

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_subtract_sse2.c
# Opt level: O0

void subtract_4x4(int16_t *diff,ptrdiff_t diff_stride,uint16_t *src,ptrdiff_t src_stride,
                 uint16_t *pred,ptrdiff_t pred_stride)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  long in_R9;
  __m128i v0;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  undefined2 local_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 local_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 local_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 local_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 local_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  int64_t *store_diff;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  
  uVar1 = *in_RDX;
  uVar2 = *(undefined8 *)((long)in_RDX + in_RCX * 2);
  uVar3 = *(undefined8 *)((long)in_RDX + in_RCX * 4);
  uVar4 = *(undefined8 *)((long)in_RDX + in_RCX * 6);
  uVar5 = *in_R8;
  uVar6 = *(undefined8 *)((long)in_R8 + in_R9 * 2);
  uVar7 = *(undefined8 *)((long)in_R8 + in_R9 * 4);
  uVar8 = *(undefined8 *)((long)in_R8 + in_R9 * 6);
  local_88 = (short)uVar1;
  uStack_86 = (short)((ulong)uVar1 >> 0x10);
  uStack_84 = (short)((ulong)uVar1 >> 0x20);
  uStack_82 = (short)((ulong)uVar1 >> 0x30);
  local_98 = (short)uVar5;
  uStack_96 = (short)((ulong)uVar5 >> 0x10);
  uStack_94 = (short)((ulong)uVar5 >> 0x20);
  uStack_92 = (short)((ulong)uVar5 >> 0x30);
  local_a8 = (short)uVar2;
  uStack_a6 = (short)((ulong)uVar2 >> 0x10);
  uStack_a4 = (short)((ulong)uVar2 >> 0x20);
  uStack_a2 = (short)((ulong)uVar2 >> 0x30);
  local_b8 = (short)uVar6;
  uStack_b6 = (short)((ulong)uVar6 >> 0x10);
  uStack_b4 = (short)((ulong)uVar6 >> 0x20);
  uStack_b2 = (short)((ulong)uVar6 >> 0x30);
  local_c8 = (short)uVar3;
  uStack_c6 = (short)((ulong)uVar3 >> 0x10);
  uStack_c4 = (short)((ulong)uVar3 >> 0x20);
  uStack_c2 = (short)((ulong)uVar3 >> 0x30);
  local_d8 = (short)uVar7;
  uStack_d6 = (short)((ulong)uVar7 >> 0x10);
  uStack_d4 = (short)((ulong)uVar7 >> 0x20);
  uStack_d2 = (short)((ulong)uVar7 >> 0x30);
  local_e8 = (short)uVar4;
  uStack_e6 = (short)((ulong)uVar4 >> 0x10);
  uStack_e4 = (short)((ulong)uVar4 >> 0x20);
  uStack_e2 = (short)((ulong)uVar4 >> 0x30);
  local_f8 = (short)uVar8;
  uStack_f6 = (short)((ulong)uVar8 >> 0x10);
  uStack_f4 = (short)((ulong)uVar8 >> 0x20);
  uStack_f2 = (short)((ulong)uVar8 >> 0x30);
  *in_RDI = CONCAT26(uStack_82 - uStack_92,
                     CONCAT24(uStack_84 - uStack_94,
                              CONCAT22(uStack_86 - uStack_96,local_88 - local_98)));
  *(ulong *)((long)in_RDI + in_RSI * 2) =
       CONCAT26(uStack_a2 - uStack_b2,
                CONCAT24(uStack_a4 - uStack_b4,CONCAT22(uStack_a6 - uStack_b6,local_a8 - local_b8)))
  ;
  *(ulong *)((long)in_RDI + in_RSI * 4) =
       CONCAT26(uStack_c2 - uStack_d2,
                CONCAT24(uStack_c4 - uStack_d4,CONCAT22(uStack_c6 - uStack_d6,local_c8 - local_d8)))
  ;
  *(ulong *)((long)in_RDI + in_RSI * 6) =
       CONCAT26(uStack_e2 - uStack_f2,
                CONCAT24(uStack_e4 - uStack_f4,CONCAT22(uStack_e6 - uStack_f6,local_e8 - local_f8)))
  ;
  return;
}

Assistant:

static void subtract_4x4(int16_t *diff, ptrdiff_t diff_stride,
                         const uint16_t *src, ptrdiff_t src_stride,
                         const uint16_t *pred, ptrdiff_t pred_stride) {
  __m128i u0, u1, u2, u3;
  __m128i v0, v1, v2, v3;
  __m128i x0, x1, x2, x3;
  int64_t *store_diff = (int64_t *)(diff + 0 * diff_stride);

  u0 = _mm_loadl_epi64((__m128i const *)(src + 0 * src_stride));
  u1 = _mm_loadl_epi64((__m128i const *)(src + 1 * src_stride));
  u2 = _mm_loadl_epi64((__m128i const *)(src + 2 * src_stride));
  u3 = _mm_loadl_epi64((__m128i const *)(src + 3 * src_stride));

  v0 = _mm_loadl_epi64((__m128i const *)(pred + 0 * pred_stride));
  v1 = _mm_loadl_epi64((__m128i const *)(pred + 1 * pred_stride));
  v2 = _mm_loadl_epi64((__m128i const *)(pred + 2 * pred_stride));
  v3 = _mm_loadl_epi64((__m128i const *)(pred + 3 * pred_stride));

  x0 = _mm_sub_epi16(u0, v0);
  x1 = _mm_sub_epi16(u1, v1);
  x2 = _mm_sub_epi16(u2, v2);
  x3 = _mm_sub_epi16(u3, v3);

  _mm_storel_epi64((__m128i *)store_diff, x0);
  store_diff = (int64_t *)(diff + 1 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x1);
  store_diff = (int64_t *)(diff + 2 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x2);
  store_diff = (int64_t *)(diff + 3 * diff_stride);
  _mm_storel_epi64((__m128i *)store_diff, x3);
}